

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t archive_read_format_zip_seekable_read_header(archive_read *a,archive_entry *entry)

{
  char *p;
  char cVar1;
  byte bVar2;
  ushort uVar3;
  zip *pzVar4;
  uLong uVar5;
  bool bVar6;
  archive_rb_tree *paVar7;
  uint16_t uVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  int iVar11;
  void *pvVar12;
  time_t tVar13;
  zip_entry *pzVar14;
  archive_rb_node *paVar15;
  la_int64_t lVar16;
  long lVar17;
  int *piVar18;
  Bytef *pBVar19;
  long request;
  uint direction;
  uchar *puVar20;
  char *pcVar21;
  int iVar22;
  int64_t iVar23;
  zip *rbt;
  ulong name_length;
  archive_string *as;
  archive_rb_node *paVar24;
  ssize_t bytes_avail;
  archive_rb_node *local_80;
  archive_rb_node *local_78;
  archive_rb_node *local_70;
  Bytef *local_68;
  archive_rb_tree *local_60;
  char *local_58;
  undefined8 local_50;
  archive_entry *local_48;
  zip *local_40;
  z_streamp local_38;
  
  pzVar4 = (zip *)a->format->data;
  if (pzVar4->has_encrypted_entries == -1) {
    pzVar4->has_encrypted_entries = 0;
  }
  (a->archive).archive_format = 0x50000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "ZIP";
  }
  if (pzVar4->zip_entries == (zip_entry *)0x0) {
    bVar6 = false;
    local_48 = entry;
    iVar23 = __archive_read_seek(a,pzVar4->central_directory_offset_adjusted,0);
    wVar10 = L'\xffffffe2';
    if (-1 < iVar23) {
      pvVar12 = __archive_read_ahead(a,0x14,(ssize_t *)&local_70);
      if (pvVar12 != (void *)0x0) {
        do {
          if ((long)local_70 < 5) {
            __archive_read_consume(a,0);
          }
          else {
            iVar23 = 0;
            bVar6 = false;
            do {
              cVar1 = *(char *)((long)pvVar12 + iVar23 + 3);
              switch(cVar1) {
              case '\x02':
                if (*(int *)((long)pvVar12 + iVar23) != 0x2014b50) goto switchD_0015e64a_caseD_3;
LAB_0015e693:
                pvVar12 = (void *)((long)pvVar12 + iVar23);
                bVar6 = true;
                break;
              case '\x03':
              case '\x04':
switchD_0015e64a_caseD_3:
                iVar23 = iVar23 + 4;
                break;
              case '\x06':
                if ((*(int *)((long)pvVar12 + iVar23) == 0x6054b50) ||
                   (*(int *)((long)pvVar12 + iVar23) == 0x6064b50)) goto LAB_0015e693;
              case '\x01':
              case '\x05':
                iVar23 = iVar23 + 1;
                break;
              default:
                if (cVar1 == 'P') {
                  iVar23 = iVar23 + 3;
                }
                else {
                  if (cVar1 != 'K') goto switchD_0015e64a_caseD_3;
                  iVar23 = iVar23 + 2;
                }
              }
            } while ((!bVar6) && (iVar23 < (long)((long)&local_70[-1].rb_info + 4)));
            __archive_read_consume(a,iVar23);
            if (bVar6) {
              lVar16 = archive_filter_bytes(&a->archive,0);
              local_50 = lVar16 - pzVar4->central_directory_offset;
              local_60 = &pzVar4->tree;
              __archive_rb_tree_init(local_60,&rb_ops);
              local_40 = (zip *)&pzVar4->tree_rsrc;
              __archive_rb_tree_init((archive_rb_tree *)local_40,&rb_rsrc_ops);
              pzVar4->central_directory_entries_total = 0;
              goto LAB_0015e726;
            }
          }
          pvVar12 = __archive_read_ahead(a,0x14,(ssize_t *)&local_70);
        } while (pvVar12 != (void *)0x0);
      }
      goto LAB_0015eaf2;
    }
    goto LAB_0015eaf5;
  }
  pzVar14 = pzVar4->entry;
  if (pzVar14 != (zip_entry *)0x0) {
    direction = 1;
    goto LAB_0015eb0b;
  }
  goto LAB_0015eb14;
LAB_0015e726:
  do {
    piVar18 = (int *)__archive_read_ahead(a,4,(ssize_t *)0x0);
    if (piVar18 == (int *)0x0) {
LAB_0015e769:
      iVar22 = 1;
    }
    else {
      iVar22 = 8;
      if ((*piVar18 != 0x6064b50) && (*piVar18 != 0x6054b50)) {
        if (*piVar18 != 0x2014b50) {
          iVar22 = -1;
          pcVar21 = "Invalid central directory signature";
LAB_0015e762:
          archive_set_error(&a->archive,iVar22,pcVar21);
          goto LAB_0015e769;
        }
        pvVar12 = __archive_read_ahead(a,0x2e,(ssize_t *)0x0);
        if (pvVar12 != (void *)0x0) {
          pzVar14 = (zip_entry *)calloc(1,0x90);
          if (pzVar14 != (zip_entry *)0x0) {
            pzVar14->next = pzVar4->zip_entries;
            pzVar14->flags = pzVar14->flags | 2;
            pzVar4->zip_entries = pzVar14;
            pzVar4->central_directory_entries_total = pzVar4->central_directory_entries_total + 1;
            pzVar14->system = *(uchar *)((long)pvVar12 + 5);
            bVar2 = *(byte *)((long)pvVar12 + 8);
            pzVar14->zip_flags = *(uint16_t *)((long)pvVar12 + 8);
            if ((bVar2 & 0x41) != 0) {
              pzVar4->has_encrypted_entries = 1;
            }
            pzVar14->compression = *(uchar *)((long)pvVar12 + 10);
            tVar13 = zip_time((char *)((long)pvVar12 + 0xc));
            pzVar14->mtime = tVar13;
            pzVar14->cm_zlib_crc32 = *(uint32_t *)((long)pvVar12 + 0x10);
            puVar20 = (uchar *)((long)pvVar12 + 0x13);
            if ((pzVar14->zip_flags & 8) != 0) {
              puVar20 = (uchar *)((long)pvVar12 + 0xd);
            }
            pzVar14->decdat = *puVar20;
            pzVar14->compressed_size = (ulong)*(uint *)((long)pvVar12 + 0x14);
            pzVar14->uncompressed_size = (ulong)*(uint *)((long)pvVar12 + 0x18);
            uVar3 = *(ushort *)((long)pvVar12 + 0x1c);
            name_length = (ulong)uVar3;
            paVar15 = (archive_rb_node *)(ulong)*(ushort *)((long)pvVar12 + 0x1e);
            local_68 = (Bytef *)(ulong)*(ushort *)((long)pvVar12 + 0x20);
            uVar8 = *(uint16_t *)((long)pvVar12 + 0x28);
            bVar2 = *(byte *)((long)pvVar12 + 0x26);
            pzVar14->local_header_offset = (ulong)*(uint *)((long)pvVar12 + 0x2a) + local_50;
            if (pzVar14->system == '\0') {
              uVar8 = 0x41fd;
              if ((bVar2 & 0x10) == 0) {
                uVar8 = 0x81b4;
              }
              pzVar14->mode = uVar8;
              if ((bVar2 & 1) != 0) {
                pzVar14->mode = pzVar14->mode & 0x16d;
              }
            }
            else if (pzVar14->system == '\x03') {
              pzVar14->mode = uVar8;
            }
            else {
              pzVar14->mode = 0;
            }
            __archive_read_consume(a,0x2e);
            pcVar21 = (char *)((long)paVar15->rb_nodes + name_length);
            local_80 = (archive_rb_node *)__archive_read_ahead(a,(size_t)pcVar21,(ssize_t *)0x0);
            if (local_80 == (archive_rb_node *)0x0) {
              iVar22 = 0x54;
              pcVar21 = "Truncated ZIP file header";
              local_80 = paVar15;
              goto LAB_0015e762;
            }
            p = (char *)((long)local_80->rb_nodes + name_length);
            local_58 = pcVar21;
            wVar9 = process_extra(a,local_48,p,(size_t)paVar15,pzVar14);
            iVar22 = 1;
            if (wVar9 != L'\0') goto LAB_0015e76e;
            paVar15 = local_80;
            if (pzVar4->process_mac_extensions == 0) {
              __archive_rb_tree_insert_node(local_60,(archive_rb_node *)pzVar14);
            }
            else {
              do {
                paVar24 = paVar15;
                pvVar12 = memchr(paVar24,0x2f,(long)p - (long)paVar24);
                paVar15 = (archive_rb_node *)((long)pvVar12 + 1);
              } while (pvVar12 != (void *)0x0);
              if ((uVar3 < 9) || (iVar22 = strncmp("__MACOSX/",(char *)local_80,9), iVar22 != 0)) {
                as = &pzVar14->rsrcname;
                (pzVar14->rsrcname).length = 0;
                archive_strncat(as,"__MACOSX/",9);
                local_38 = (z_streamp)((long)paVar24 - (long)local_80);
                archive_strncat(as,local_80,(size_t)local_38);
                archive_strcat(as,"._");
                archive_strncat(as,paVar24,name_length - (long)local_38);
                rbt = (zip *)local_60;
              }
              else {
                if ((p[-1] != '/') &&
                   ((((long)paVar24 - (long)local_80 < 3 || (*(char *)paVar24->rb_nodes != '.')) ||
                    (*(char *)((long)paVar24->rb_nodes + 1) != '_')))) {
                  __archive_rb_tree_insert_node(local_60,(archive_rb_node *)pzVar14);
                  expose_parent_dirs(pzVar4,(char *)local_80,name_length);
                  goto LAB_0015ea5d;
                }
                (pzVar14->rsrcname).length = 0;
                archive_strncat(&pzVar14->rsrcname,local_80,name_length);
                rbt = local_40;
              }
              __archive_rb_tree_insert_node((archive_rb_tree *)rbt,(archive_rb_node *)pzVar14);
            }
LAB_0015ea5d:
            __archive_read_consume(a,(int64_t)(local_58 + (long)local_68));
            iVar22 = 0;
            goto LAB_0015e76e;
          }
          archive_set_error(&a->archive,0xc,"Can\'t allocate zip entry");
        }
        iVar22 = 1;
      }
    }
LAB_0015e76e:
  } while (iVar22 == 0);
  if (iVar22 == 8) {
    wVar10 = L'\0';
    bVar6 = true;
  }
  else {
LAB_0015eaf2:
    bVar6 = false;
  }
LAB_0015eaf5:
  if (!bVar6) {
    return wVar10;
  }
  pzVar14 = (zip_entry *)0x0;
  direction = 0;
  entry = local_48;
LAB_0015eb0b:
  pzVar14 = (zip_entry *)__archive_rb_tree_iterate(&pzVar4->tree,&pzVar14->node,direction);
  pzVar4->entry = pzVar14;
LAB_0015eb14:
  if (pzVar4->entry == (zip_entry *)0x0) {
    return L'\x01';
  }
  pcVar21 = (pzVar4->entry->rsrcname).s;
  if (pcVar21 == (char *)0x0) {
    paVar15 = (archive_rb_node *)0x0;
  }
  else {
    paVar15 = __archive_rb_tree_find_node(&pzVar4->tree_rsrc,pcVar21);
  }
  if (pzVar4->cctx_valid != '\0') {
    aes_ctr_release(&pzVar4->cctx);
  }
  if (pzVar4->hctx_valid != '\0') {
    __hmac_sha1_cleanup(&pzVar4->hctx);
  }
  pzVar4->hctx_valid = '\0';
  pzVar4->cctx_valid = '\0';
  pzVar4->tctx_valid = '\0';
  __archive_read_reset_passphrase(a);
  lVar16 = archive_filter_bytes(&a->archive,0);
  lVar17 = pzVar4->entry->local_header_offset;
  request = lVar17 - lVar16;
  if (request == 0 || lVar17 < lVar16) {
    if (request != 0) {
      __archive_read_seek(a,lVar17,0);
    }
  }
  else {
    __archive_read_consume(a,request);
  }
  pzVar4->unconsumed = 0;
  wVar10 = zip_read_local_file_header(a,entry,pzVar4);
  if (wVar10 != L'\0') {
    return wVar10;
  }
  if (paVar15 == (archive_rb_node *)0x0) {
    return L'\0';
  }
  pzVar4 = (zip *)a->format->data;
  lVar16 = archive_filter_bytes(&a->archive,0);
  bVar2 = *(byte *)(paVar15[5].rb_nodes + 1);
  if (bVar2 == 8) {
LAB_0015ec27:
    paVar24 = paVar15[2].rb_nodes[0];
    if ((long)paVar24 < 0x400001) {
      if ((long)paVar15[1].rb_info < 0x400001) {
        local_68 = (Bytef *)malloc((size_t)paVar24);
        if (local_68 == (Bytef *)0x0) {
          pcVar21 = "Can\'t allocate memory for Mac metadata";
          iVar22 = 0xc;
          local_68 = (Bytef *)0x0;
          goto LAB_0015ecfc;
        }
        paVar24 = paVar15[1].rb_nodes[1];
        lVar17 = (long)paVar24 - lVar16;
        if (lVar17 == 0 || (long)paVar24 < lVar16) {
          if (lVar17 != 0) {
            __archive_read_seek(a,(int64_t)paVar24,0);
          }
        }
        else {
          __archive_read_consume(a,lVar17);
        }
        piVar18 = (int *)__archive_read_ahead(a,0x1e,(ssize_t *)0x0);
        local_58 = (char *)lVar16;
        if (piVar18 == (int *)0x0) {
          pcVar21 = "Truncated ZIP file header";
          iVar22 = 0x54;
LAB_0015ed70:
          archive_set_error(&a->archive,iVar22,pcVar21);
          iVar23 = -0x14;
        }
        else {
          if (*piVar18 != 0x4034b50) {
            pcVar21 = "Damaged Zip archive";
            iVar22 = -1;
            goto LAB_0015ed70;
          }
          iVar23 = (ulong)*(ushort *)((long)piVar18 + 0x1a) + (ulong)*(ushort *)(piVar18 + 7) + 0x1e
          ;
        }
        __archive_read_consume(a,iVar23);
        paVar24 = (archive_rb_node *)paVar15[1].rb_info;
        local_78 = paVar15[2].rb_nodes[0];
        local_38 = &pzVar4->stream;
        wVar10 = L'\0';
        iVar22 = 0;
        local_60 = (archive_rb_tree *)local_68;
        local_48 = entry;
        local_40 = pzVar4;
        do {
          pBVar19 = local_68;
          if ((iVar22 != 0) || (paVar24 == (archive_rb_node *)0x0)) {
            archive_entry_copy_mac_metadata
                      (local_48,local_68,(long)paVar15[2].rb_nodes[0] - (long)local_78);
            goto LAB_0015eff7;
          }
          pBVar19 = (Bytef *)__archive_read_ahead(a,1,(ssize_t *)&local_70);
          pzVar4 = local_40;
          paVar7 = local_60;
          if (pBVar19 == (Bytef *)0x0) {
            archive_set_error(&a->archive,0x54,"Truncated ZIP file header");
            iVar11 = 5;
            wVar10 = L'\xffffffec';
          }
          else {
            if (paVar24 < local_70) {
              local_70 = paVar24;
            }
            if (*(char *)(paVar15[5].rb_nodes + 1) == '\b') {
              local_50 = (ulong)local_50._4_4_ << 0x20;
              wVar10 = zip_deflate_init(a,local_40);
              paVar7 = local_60;
              if (wVar10 == L'\0') {
                (pzVar4->stream).next_in = pBVar19;
                (pzVar4->stream).avail_in = (uInt)local_70;
                (pzVar4->stream).total_in = 0;
                (pzVar4->stream).next_out = (Bytef *)local_60;
                (pzVar4->stream).avail_out = (uInt)local_78;
                (pzVar4->stream).total_out = 0;
                iVar22 = cm_zlib_inflate(local_38,0);
                if (iVar22 == -4) {
                  archive_set_error(&a->archive,0xc,"Out of memory for ZIP decompression");
LAB_0015ef8c:
                  bVar6 = false;
                  wVar10 = L'\xffffffe2';
                }
                else {
                  if (iVar22 != 0) {
                    if (iVar22 != 1) {
                      archive_set_error(&a->archive,-1,"ZIP decompression failed (%d)");
                      goto LAB_0015ef8c;
                    }
                    local_50 = CONCAT44(local_50._4_4_,1);
                  }
                  local_80 = (archive_rb_node *)(pzVar4->stream).total_in;
                  uVar5 = (pzVar4->stream).total_out;
                  local_78 = (archive_rb_node *)((long)local_78 - uVar5);
                  local_60 = (archive_rb_tree *)((long)paVar7 + uVar5);
                  bVar6 = true;
                  wVar10 = L'\0';
                }
              }
              else {
                bVar6 = false;
              }
              iVar11 = 5;
              iVar22 = (int)local_50;
              if (!bVar6) goto LAB_0015efba;
            }
            else if (*(char *)(paVar15[5].rb_nodes + 1) == '\0') {
              local_50 = (ulong)local_50._4_4_ << 0x20;
              if (local_78 < local_70) {
                local_70 = local_78;
              }
              memcpy(local_60,pBVar19,(size_t)local_70);
              local_60 = (archive_rb_tree *)((long)paVar7 + (long)local_70);
              local_78 = (archive_rb_node *)((long)local_78 - (long)local_70);
              local_80 = local_70;
              iVar22 = (int)local_50;
              if (local_78 == (archive_rb_node *)0x0) {
                iVar22 = 1;
              }
            }
            else {
              local_80 = (archive_rb_node *)0x0;
            }
            __archive_read_consume(a,(int64_t)local_80);
            paVar24 = (archive_rb_node *)((long)paVar24 - (long)local_80);
            iVar11 = 0;
          }
LAB_0015efba:
        } while (iVar11 == 0);
        pBVar19 = local_68;
        if (iVar11 == 5) {
LAB_0015eff7:
          __archive_read_seek(a,(int64_t)local_58,0);
          local_40->decompress_init = '\0';
          free(pBVar19);
        }
        goto LAB_0015ed09;
      }
      pcVar21 = "Mac metadata is too large: %jd > 4M bytes";
      paVar24 = (archive_rb_node *)paVar15[1].rb_info;
    }
    else {
      pcVar21 = "Mac metadata is too large: %jd > 4M bytes";
    }
  }
  else {
    if (bVar2 == 0) {
      if (paVar15[2].rb_nodes[0] == (archive_rb_node *)paVar15[1].rb_info) goto LAB_0015ec27;
      pcVar21 = "Malformed OS X metadata entry: inconsistent size";
      iVar22 = 0x54;
LAB_0015ecfc:
      archive_set_error(&a->archive,iVar22,pcVar21);
      wVar10 = L'\xffffffe2';
      goto LAB_0015ed09;
    }
    lVar17 = 8;
    paVar24 = (archive_rb_node *)0x25b068;
    do {
      if (*(uint *)((long)&PTR_bid_keyword_keys_u_002aebe8 + lVar17) == (uint)bVar2) {
        paVar24 = *(archive_rb_node **)((long)&compression_methods[0].id + lVar17);
        break;
      }
      lVar17 = lVar17 + 0x10;
    } while (lVar17 != 0x1a8);
    pcVar21 = "Unsupported ZIP compression method (%s)";
  }
  archive_set_error(&a->archive,0x54,pcVar21,paVar24);
  wVar10 = L'\xffffffec';
LAB_0015ed09:
  return wVar10 >> 0x1f & wVar10;
}

Assistant:

static int
archive_read_format_zip_seekable_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct zip *zip = (struct zip *)a->format->data;
	struct zip_entry *rsrc;
	int64_t offset;
	int r, ret = ARCHIVE_OK;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries ==
			ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW)
		zip->has_encrypted_entries = 0;

	a->archive.archive_format = ARCHIVE_FORMAT_ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "ZIP";

	if (zip->zip_entries == NULL) {
		r = slurp_central_directory(a, entry, zip);
		if (r != ARCHIVE_OK)
			return r;
		/* Get first entry whose local header offset is lower than
		 * other entries in the archive file. */
		zip->entry =
		    (struct zip_entry *)ARCHIVE_RB_TREE_MIN(&zip->tree);
	} else if (zip->entry != NULL) {
		/* Get next entry in local header offset order. */
		zip->entry = (struct zip_entry *)__archive_rb_tree_iterate(
		    &zip->tree, &zip->entry->node, ARCHIVE_RB_DIR_RIGHT);
	}

	if (zip->entry == NULL)
		return ARCHIVE_EOF;

	if (zip->entry->rsrcname.s)
		rsrc = (struct zip_entry *)__archive_rb_tree_find_node(
		    &zip->tree_rsrc, zip->entry->rsrcname.s);
	else
		rsrc = NULL;

	if (zip->cctx_valid)
		archive_decrypto_aes_ctr_release(&zip->cctx);
	if (zip->hctx_valid)
		archive_hmac_sha1_cleanup(&zip->hctx);
	zip->tctx_valid = zip->cctx_valid = zip->hctx_valid = 0;
	__archive_read_reset_passphrase(a);

	/* File entries are sorted by the header offset, we should mostly
	 * use __archive_read_consume to advance a read point to avoid
	 * redundant data reading.  */
	offset = archive_filter_bytes(&a->archive, 0);
	if (offset < zip->entry->local_header_offset)
		__archive_read_consume(a,
		    zip->entry->local_header_offset - offset);
	else if (offset != zip->entry->local_header_offset) {
		__archive_read_seek(a, zip->entry->local_header_offset,
		    SEEK_SET);
	}
	zip->unconsumed = 0;
	r = zip_read_local_file_header(a, entry, zip);
	if (r != ARCHIVE_OK)
		return r;
	if (rsrc) {
		int ret2 = zip_read_mac_metadata(a, entry, rsrc);
		if (ret2 < ret)
			ret = ret2;
	}
	return (ret);
}